

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O2

void __thiscall Database::~Database(Database *this)

{
  IndexTree *this_00;
  ulong uVar1;
  
  this_00 = this->index;
  if (this_00 != (IndexTree *)0x0) {
    IndexTree::~IndexTree(this_00);
  }
  operator_delete(this_00);
  for (uVar1 = 0; uVar1 < this->metadata->sliceCount; uVar1 = uVar1 + 1) {
    munmap(this->slices[uVar1],0x2000000);
    close(this->slice_fd[uVar1]);
  }
  munmap(this->metadata,0x1000);
  close(this->metadata_fd);
  std::__cxx11::string::~string((string *)&this->file_prefix);
  return;
}

Assistant:

Database::~Database() {
    delete index;
    // unmap all opened files
    for (int i = 0; i < metadata->sliceCount; ++i) {
        munmap(slices[i], SLICE_SIZE);
        close(slice_fd[i]);
    }
    munmap(metadata, 4096);
    close(metadata_fd);
}